

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qbuffer.cpp
# Opt level: O0

void QBuffer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int in_EDX;
  int in_ESI;
  QBufferPrivate *in_RDI;
  QBuffer *_t;
  
  if ((in_ESI == 0) && (in_EDX == 0)) {
    d_func((QBuffer *)0x27478f);
    QBufferPrivate::_q_emitSignals(in_RDI);
  }
  return;
}

Assistant:

void QBuffer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QBuffer *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->d_func()->_q_emitSignals(); break;
        default: ;
        }
    }
    (void)_a;
}